

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bra.c
# Opt level: O1

SizeT ARMT_Convert(Byte *data,SizeT size,UInt32 ip,int encoding)

{
  uint uVar1;
  SizeT SVar2;
  int iVar3;
  int iVar4;
  
  if (size < 4) {
    return 0;
  }
  SVar2 = 0;
  do {
    if (((data[SVar2 + 1] & 0xf8) == 0xf0) && ((~(uint)data[SVar2 + 3] & 0xf8) == 0)) {
      iVar3 = ip + 4 + (int)SVar2;
      iVar4 = -iVar3;
      if (encoding != 0) {
        iVar4 = iVar3;
      }
      uVar1 = iVar4 + ((uint)data[SVar2 + 2] |
                      (data[SVar2 + 3] & 7) << 8 |
                      (uint)data[SVar2] << 0xb | (data[SVar2 + 1] & 7) << 0x13) * 2;
      data[SVar2 + 1] = (byte)(uVar1 >> 0x14) & 7 | 0xf0;
      data[SVar2] = (Byte)(uVar1 >> 0xc);
      data[SVar2 + 3] = (byte)(uVar1 >> 9) | 0xf8;
      data[SVar2 + 2] = (Byte)(uVar1 >> 1);
      SVar2 = SVar2 + 2;
    }
    SVar2 = SVar2 + 2;
  } while (SVar2 <= size - 4);
  return SVar2;
}

Assistant:

SizeT ARMT_Convert(Byte *data, SizeT size, UInt32 ip, int encoding)
{
  SizeT i;
  if (size < 4)
    return 0;
  size -= 4;
  ip += 4;
  for (i = 0; i <= size; i += 2)
  {
    if ((data[i + 1] & 0xF8) == 0xF0 &&
        (data[i + 3] & 0xF8) == 0xF8)
    {
      UInt32 dest;
      UInt32 src =
        (((UInt32)data[i + 1] & 0x7) << 19) |
        ((UInt32)data[i + 0] << 11) |
        (((UInt32)data[i + 3] & 0x7) << 8) |
        (data[i + 2]);
      
      src <<= 1;
      if (encoding)
        dest = ip + (UInt32)i + src;
      else
        dest = src - (ip + (UInt32)i);
      dest >>= 1;
      
      data[i + 1] = (Byte)(0xF0 | ((dest >> 19) & 0x7));
      data[i + 0] = (Byte)(dest >> 11);
      data[i + 3] = (Byte)(0xF8 | ((dest >> 8) & 0x7));
      data[i + 2] = (Byte)dest;
      i += 2;
    }
  }
  return i;
}